

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fColorClearTest.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::ColorClearTest::init(ColorClearTest *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"single_rgb","single_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x10000001e;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000000000003;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"single_rgba","single_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x10000001e;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000100000003;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"multiple_rgb","multiple_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000000000014;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"multiple_rgba","multiple_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000100000014;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"long_rgb","long_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x6400000002;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1000000000001f4;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"long_rgba","long_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x6400000002;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1000001000001f4;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"subclears_rgb","subclears_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x1e;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"subclears_rgba","subclears_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0x1e;
  *(undefined1 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 1;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 5) = 0;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"short_scissored_rgb","short_scissored_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x20000001e;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100010000000004;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"scissored_rgb","scissored_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10001000000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"scissored_rgba","scissored_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10001010000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"masked_rgb","masked_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10001000000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"masked_rgba","masked_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10001010000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"masked_scissored_rgb","masked_scissored_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10101000000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"masked_scissored_rgba","masked_scissored_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x40000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10101010000001e;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"complex_rgb","complex_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x50000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1010000000032;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"complex_rgba","complex_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x50000000f;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1010100000032;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"long_masked_rgb","long_masked_rgb");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x6400000002;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1010100000001f4;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"long_masked_rgba","long_masked_rgba");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02147ec0;
  pTVar2[1].m_testCtx = (TestContext *)0x6400000002;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x1010101000001f4;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ColorClearTest::init (void)
{
	//										name					iters,	#..#,		alpha?,	scissor,masks,	1stfull?
	addChild(new ColorClearCase(m_context, "single_rgb",			30,		1,3,		false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "single_rgba",			30,		1,3,		true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "multiple_rgb",			15,		4,20,		false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "multiple_rgba",			15,		4,20,		true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "long_rgb",				2,		100,500,	false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "long_rgba",				2,		100,500,	true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "subclears_rgb",			15,		4,30,		false,	false,	false,	false	));
	addChild(new ColorClearCase(m_context, "subclears_rgba",		15,		4,30,		true,	false,	false,	false	));
	addChild(new ColorClearCase(m_context, "short_scissored_rgb",	30,		2,4,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "scissored_rgb",			15,		4,30,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "scissored_rgba",		15,		4,30,		true,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_rgb",			15,		4,30,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_rgba",			15,		4,30,		true,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_scissored_rgb",	15,		4,30,		false,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "masked_scissored_rgba",	15,		4,30,		true,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "complex_rgb",			15,		5,50,		false,	true,	true,	false	));
	addChild(new ColorClearCase(m_context, "complex_rgba",			15,		5,50,		true,	true,	true,	false	));
	addChild(new ColorClearCase(m_context, "long_masked_rgb",		2,		100,500,	false,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "long_masked_rgba",		2,		100,500,	true,	true,	true,	true	));
}